

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multitexturedmesh.cc
# Opt level: O1

void __thiscall gvr::MultiTexturedMesh::resizeTriangleList(MultiTexturedMesh *this,int tn)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  UVT *pUVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  UVT *pUVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)tn;
  uVar12 = 0xffffffffffffffff;
  if (SUB168(auVar4 * ZEXT816(0x1c),8) == 0) {
    uVar12 = SUB168(auVar4 * ZEXT816(0x1c),0);
  }
  pUVar8 = (UVT *)operator_new__(uVar12);
  uVar9 = (this->super_Mesh).n;
  if (tn <= (int)uVar9) {
    uVar9 = tn;
  }
  if (0 < (int)uVar9) {
    pUVar3 = this->uvt;
    lVar10 = (ulong)uVar9 + 1;
    lVar11 = (ulong)uVar9 * 0x1c;
    do {
      puVar1 = (undefined8 *)((long)pUVar3[-1].uv + lVar11);
      uVar5 = *puVar1;
      uVar6 = puVar1[1];
      puVar1 = (undefined8 *)((long)pUVar3[-1].uv + lVar11 + 0xc);
      uVar7 = puVar1[1];
      puVar2 = (undefined8 *)((long)pUVar8[-1].uv + lVar11 + 0xc);
      *puVar2 = *puVar1;
      puVar2[1] = uVar7;
      puVar1 = (undefined8 *)((long)pUVar8[-1].uv + lVar11);
      *puVar1 = uVar5;
      puVar1[1] = uVar6;
      lVar10 = lVar10 + -1;
      lVar11 = lVar11 + -0x1c;
    } while (1 < lVar10);
  }
  if (this->uvt != (UVT *)0x0) {
    operator_delete__(this->uvt);
  }
  this->uvt = pUVar8;
  Mesh::resizeTriangleList(&this->super_Mesh,tn);
  return;
}

Assistant:

void MultiTexturedMesh::resizeTriangleList(int tn)
{
  UVT *p=new UVT [tn];

  for (int i=std::min(getTriangleCount(), tn)-1; i>=0; i--)
  {
    p[i]=uvt[i];
  }

  delete [] uvt;

  uvt=p;

  Mesh::resizeTriangleList(tn);
}